

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

void setDateTime(QDateTimeData *d,QDate date,QTime time)

{
  bool bVar1;
  Int IVar2;
  QFlagsStorage<QDateTimePrivate::StatusFlag> QVar3;
  QDateTimePrivate *pQVar4;
  int in_EDX;
  Data *in_RDI;
  long in_FS_OFFSET;
  int ds;
  qint64 days;
  qint64 msecs;
  StatusFlags newStatus;
  undefined8 in_stack_ffffffffffffffa8;
  StatusFlag flags;
  qint64 qVar5;
  enum_type in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  enum_type f1;
  long millisInDay;
  QFlagsStorage<QDateTimePrivate::StatusFlag> in_stack_ffffffffffffffd0;
  Int in_stack_ffffffffffffffd4;
  Int local_20;
  QFlagsStorage<QDateTimePrivate::StatusFlag> local_1c;
  int local_18;
  QTime local_14;
  QDate local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_14.mds = in_EDX;
  bVar1 = QTime::isValid(&local_14);
  if ((!bVar1) && (bVar1 = QDate::isValid((QDate *)in_RDI), bVar1)) {
    local_18 = (int)QTime::fromMSecsSinceStartOfDay((int)in_stack_ffffffffffffffa8);
    local_14 = (QTime)local_18;
  }
  flags = (StatusFlag)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_1c.i = 0xaaaaaaaa;
  memset(&local_1c,0,4);
  QFlags<QDateTimePrivate::StatusFlag>::QFlags((QFlags<QDateTimePrivate::StatusFlag> *)0x56ddf6);
  millisInDay = 0;
  bVar1 = QDate::isValid((QDate *)in_RDI);
  if (bVar1) {
    qVar5 = QDate::toJulianDay(&local_10);
    millisInDay = qVar5 + -0x253d8c;
    QFlags<QDateTimePrivate::StatusFlag>::QFlags
              ((QFlags<QDateTimePrivate::StatusFlag> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),flags);
    local_1c.i = local_20;
  }
  f1 = 0;
  bVar1 = QTime::isValid(&local_14);
  if (bVar1) {
    f1 = QTime::msecsSinceStartOfDay(&local_14);
    QFlags<QDateTimePrivate::StatusFlag>::operator|=
              ((QFlags<QDateTimePrivate::StatusFlag> *)&local_1c,ValidTime);
  }
  if ((millisInDay < 0) && (0 < (int)f1)) {
    millisInDay = millisInDay + 1;
    f1 = f1 + 0xfad9a400;
  }
  bVar1 = daysAndMillisOverflow
                    ((qint64)in_RDI,millisInDay,(qint64 *)CONCAT44(f1,in_stack_ffffffffffffffb0));
  if (bVar1) {
    memset(&stack0xffffffffffffffd4,0,4);
    QFlags<QDateTimePrivate::StatusFlag>::QFlags((QFlags<QDateTimePrivate::StatusFlag> *)0x56deda);
    local_1c.i = in_stack_ffffffffffffffd4;
  }
  bVar1 = QDateTime::Data::isShort(in_RDI);
  if (bVar1) {
    bVar1 = msecsCanBeSmall(CONCAT44(f1,in_stack_ffffffffffffffb0));
    if (bVar1) {
      *(ulong *)in_RDI = *(ulong *)in_RDI & 0xff;
      in_stack_ffffffffffffffd0.i = (Int)operator|(f1,in_stack_ffffffffffffffb0);
      IVar2 = QFlags<QDateTimePrivate::StatusFlag>::toInt
                        ((QFlags<QDateTimePrivate::StatusFlag> *)&stack0xffffffffffffffd0);
      *(ulong *)in_RDI =
           *(ulong *)in_RDI & 0xffffffffffffff00 |
           (ulong)((uint)*(ulong *)in_RDI & 0xff & (IVar2 ^ 0xffffffff));
      IVar2 = QFlags<QDateTimePrivate::StatusFlag>::toInt
                        ((QFlags<QDateTimePrivate::StatusFlag> *)&local_1c);
      *(ulong *)in_RDI =
           *(ulong *)in_RDI & 0xffffffffffffff00 |
           (ulong)((uint)*(ulong *)in_RDI & 0xff | IVar2) & 0xff;
    }
    else {
      QDateTime::Data::detach
                ((Data *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0.i));
    }
  }
  bVar1 = QDateTime::Data::isShort(in_RDI);
  if (!bVar1) {
    QDateTime::Data::detach((Data *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0.i))
    ;
    qVar5 = 0;
    pQVar4 = QDateTime::Data::operator->(in_RDI);
    pQVar4->m_msecs = qVar5;
    operator|(f1,in_stack_ffffffffffffffb0);
    QVar3.i = (Int)QFlags<QDateTimePrivate::StatusFlag>::operator~
                             ((QFlags<QDateTimePrivate::StatusFlag> *)
                              CONCAT44(f1,in_stack_ffffffffffffffb0));
    pQVar4 = QDateTime::Data::operator->(in_RDI);
    QFlags<QDateTimePrivate::StatusFlag>::operator&=
              (&pQVar4->m_status,(QFlags<QDateTimePrivate::StatusFlag>)QVar3.i);
    QVar3.i = local_1c.i;
    pQVar4 = QDateTime::Data::operator->(in_RDI);
    QFlags<QDateTimePrivate::StatusFlag>::operator|=
              (&pQVar4->m_status,(QFlags<QDateTimePrivate::StatusFlag>)QVar3.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void setDateTime(QDateTimeData &d, QDate date, QTime time)
{
    // If the date is valid and the time is not we set time to 00:00:00
    if (!time.isValid() && date.isValid())
        time = QTime::fromMSecsSinceStartOfDay(0);

    QDateTimePrivate::StatusFlags newStatus = { };

    // Set date value and status
    qint64 days = 0;
    if (date.isValid()) {
        days = date.toJulianDay() - JULIAN_DAY_FOR_EPOCH;
        newStatus = QDateTimePrivate::ValidDate;
    }

    // Set time value and status
    int ds = 0;
    if (time.isValid()) {
        ds = time.msecsSinceStartOfDay();
        newStatus |= QDateTimePrivate::ValidTime;
    }
    Q_ASSERT(ds < MSECS_PER_DAY);
    // Only the later parts of the very first day are representable - its start
    // would overflow - so get ds the same side of 0 as days:
    if (days < 0 && ds > 0) {
        days++;
        ds -= MSECS_PER_DAY;
    }

    // Check in representable range:
    qint64 msecs = 0;
    if (daysAndMillisOverflow(days, qint64(ds), &msecs)) {
        newStatus = QDateTimePrivate::StatusFlags{};
        msecs = 0;
    }
    if (d.isShort()) {
        // let's see if we can keep this short
        if (msecsCanBeSmall(msecs)) {
            // yes, we can
            d.data.msecs = qintptr(msecs);
            d.data.status &= ~(QDateTimePrivate::ValidityMask | QDateTimePrivate::DaylightMask).toInt();
            d.data.status |= newStatus.toInt();
        } else {
            // nope...
            d.detach();
        }
    }
    if (!d.isShort()) {
        d.detach();
        d->m_msecs = msecs;
        d->m_status &= ~(QDateTimePrivate::ValidityMask | QDateTimePrivate::DaylightMask);
        d->m_status |= newStatus;
    }
}